

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O2

bool Fossilize::decode_varint(uint32_t *words,size_t words_size,uint8_t *buffer,size_t buffer_size)

{
  uint8_t *puVar1;
  uint uVar2;
  size_t i;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  
  sVar4 = 0;
  for (uVar3 = 0; sVar5 = sVar4, uVar3 != words_size; uVar3 = uVar3 + 1) {
    words[uVar3] = 0;
    uVar6 = 0;
    uVar2 = 0;
    do {
      if ((buffer_size <= sVar5) || (0x1f < uVar2)) goto LAB_0016ff3a;
      uVar6 = uVar6 | (buffer[sVar5] & 0x7f) << ((byte)uVar2 & 0x1f);
      words[uVar3] = uVar6;
      uVar2 = uVar2 + 7;
      sVar4 = sVar5 + 1;
      puVar1 = buffer + sVar5;
      sVar5 = sVar4;
    } while ((char)*puVar1 < '\0');
  }
LAB_0016ff3a:
  return sVar5 == buffer_size && words_size <= uVar3;
}

Assistant:

bool decode_varint(uint32_t *words, size_t words_size, const uint8_t *buffer, size_t buffer_size)
{
	size_t offset = 0;
	for (size_t i = 0; i < words_size; i++)
	{
		auto &w = words[i];
		w = 0;

		uint32_t shift = 0;
		do
		{
			if (offset >= buffer_size || shift >= 32u)
				return false;

			w |= (buffer[offset] & 0x7f) << shift;
			shift += 7;
		} while (buffer[offset++] & 0x80);
	}

	return buffer_size == offset;
}